

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_slist.c
# Opt level: O0

size_t ares_slist_max_level(ares_slist_t *list)

{
  size_t n;
  ulong local_18;
  size_t max_level;
  ares_slist_t *list_local;
  
  if (list->cnt + 1 < 0x11) {
    local_18 = 4;
  }
  else {
    n = ares_round_up_pow2(list->cnt + 1);
    local_18 = ares_log2(n);
  }
  if (local_18 < list->levels) {
    local_18 = list->levels;
  }
  return local_18;
}

Assistant:

static size_t ares_slist_max_level(const ares_slist_t *list)
{
  size_t max_level = 0;

  if (list->cnt + 1 <= (1 << ARES__SLIST_START_LEVELS)) {
    max_level = ARES__SLIST_START_LEVELS;
  } else {
    max_level = ares_log2(ares_round_up_pow2(list->cnt + 1));
  }

  if (list->levels > max_level) {
    max_level = list->levels;
  }

  return max_level;
}